

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O1

void __thiscall glslang::TParseContext::~TParseContext(TParseContext *this)

{
  ~TParseContext(this);
  operator_delete(this,0x8828);
  return;
}

Assistant:

TParseContext::~TParseContext()
{
    delete [] atomicUintOffsets;
}